

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testEmptyKNNValidationGood(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *nnModel;
  NearestNeighborsIndex *this;
  ostream *poVar2;
  Result local_e8;
  Result local_c0;
  undefined4 local_94;
  undefined1 local_90 [8];
  Result res;
  SingleKdTreeIndex *kdTree;
  NearestNeighborsIndex *nnIndex;
  KNearestNeighborsClassifier *knnClassifier;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  nnModel = CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  CoreML::KNNValidatorTests::setNumberOfNeighbors(nnModel,3,true);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(nnModel);
  this = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(nnModel);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this);
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this);
  CoreML::Specification::SingleKdTreeIndex::set_leafsize
            ((SingleKdTreeIndex *)res.m_message.field_2._8_8_,0x1e);
  CoreML::validate<(MLModelType)404>((Result *)local_90,(Model *)local_40);
  bVar1 = CoreML::Result::good((Result *)local_90);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x17d);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel<char_const(&)[8]>
              (nnModel,(char (*) [8])"Default");
    CoreML::validate<(MLModelType)404>(&local_c0,(Model *)local_40);
    CoreML::Result::operator=((Result *)local_90,&local_c0);
    CoreML::Result::~Result(&local_c0);
    bVar1 = CoreML::Result::good((Result *)local_90);
    if (bVar1) {
      CoreML::Specification::KNearestNeighborsClassifier::clear_defaultstringlabel(nnModel);
      CoreML::validate<(MLModelType)404>(&local_e8,(Model *)local_40);
      CoreML::Result::operator=((Result *)local_90,&local_e8);
      CoreML::Result::~Result(&local_e8);
      bVar1 = CoreML::Result::good((Result *)local_90);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x189);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"!((res).good())");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
      else {
        m1._oneof_case_[0] = 0;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x183);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(res).good()");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  local_94 = 1;
  CoreML::Result::~Result((Result *)local_90);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testEmptyKNNValidationGood() {
    
    Specification::Model m1;
    
    KNNValidatorTests::generateInterface(m1);
    
    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();
    
    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    
    // Validation should fail since we are not telling the label type.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);
    
    knnClassifier->set_defaultstringlabel("Default");
    
    // Validation should pass now.
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);
    
    knnClassifier->clear_defaultstringlabel();
    
    // Validation should fail since we are not telling the label type.
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;    
}